

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownInFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var1;
  FilterPushdownResult FVar2;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var3;
  bool bVar4;
  BoundOperatorExpression *pBVar5;
  reference pvVar6;
  pointer pEVar7;
  BoundColumnRefExpression *pBVar8;
  BoundConstantExpression *pBVar9;
  reference pvVar10;
  pointer pOVar11;
  Value *args_1;
  idx_t i_1;
  size_t i;
  ulong uVar12;
  ExpressionType local_81;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_80;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_78;
  const_reference local_70;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_68;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_60;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_58;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_50;
  vector<duckdb::Value,_true> in_list;
  
  if ((expr->super_BaseExpression).type == COMPARE_IN) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundOperatorExpression>(&expr->super_BaseExpression);
    this_00 = &pBVar5->children;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(this_00,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    if ((pEVar7->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_00,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      pBVar8 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar7->super_BaseExpression)
      ;
      local_70 = vector<duckdb::ColumnIndex,_true>::get<true>
                           (column_ids,(pBVar8->binding).column_index);
      uVar12 = 1;
      do {
        if ((ulong)((long)(pBVar5->children).
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pBVar5->children).
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar12) {
          uVar12 = 1;
          pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::get<true>(this_00,1);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar6);
          pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar7->super_BaseExpression);
          args_1 = &pBVar9->value;
          if (((long)(pBVar5->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pBVar5->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x10) &&
             (bVar4 = TypeSupportsConstantFilter(&args_1->type_), bVar4)) {
            local_78._M_head_impl._0_1_ = 0x19;
            make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value&>
                      ((duckdb *)&in_list,(ExpressionType *)&local_78,args_1);
            local_50._M_head_impl =
                 (TableFilter *)
                 in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
            in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            TableFilterSet::PushFilter
                      (table_filters,local_70,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_50);
            if ((pointer)local_50._M_head_impl != (pointer)0x0) {
              (**(code **)(*(long *)&(local_50._M_head_impl)->_vptr_TableFilter + 8))();
            }
            local_50._M_head_impl = (TableFilter *)0x0;
            if (in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)(*(long *)&(in_list.
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->type_ + 8))();
            }
            return PUSHED_DOWN_FULLY;
          }
          in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          in_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (; uVar12 < (ulong)((long)(pBVar5->children).
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pBVar5->children).
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar12 = uVar12 + 1) {
            pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::get<true>(this_00,uVar12);
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(pvVar6);
            pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                               (&pEVar7->super_BaseExpression);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&in_list,
                       &pBVar9->value);
          }
          bVar4 = LogicalType::IsIntegral(&args_1->type_);
          if ((bVar4) && (bVar4 = IsDenseRange(&in_list), bVar4)) {
            local_80._M_head_impl._0_1_ = 0x1e;
            pvVar10 = vector<duckdb::Value,_true>::front(&in_list);
            make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value>
                      ((duckdb *)&local_78,(ExpressionType *)&local_80,pvVar10);
            local_81 = COMPARE_LESSTHANOREQUALTO;
            pvVar10 = vector<duckdb::Value,_true>::back(&in_list);
            make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value>
                      ((duckdb *)&local_80,&local_81,pvVar10);
            local_58._M_head_impl = local_78._M_head_impl;
            local_78._M_head_impl = (OptionalFilter *)0x0;
            TableFilterSet::PushFilter
                      (table_filters,local_70,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_58);
            if (local_58._M_head_impl != (OptionalFilter *)0x0) {
              (*((local_58._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
            }
            local_60._M_head_impl = local_80._M_head_impl;
            local_58._M_head_impl = (OptionalFilter *)0x0;
            local_80._M_head_impl = (TableFilter *)0x0;
            TableFilterSet::PushFilter
                      (table_filters,local_70,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_60);
            if (local_60._M_head_impl != (TableFilter *)0x0) {
              (*(local_60._M_head_impl)->_vptr_TableFilter[1])();
            }
            local_60._M_head_impl = (TableFilter *)0x0;
            if (local_80._M_head_impl != (TableFilter *)0x0) {
              (*(local_80._M_head_impl)->_vptr_TableFilter[1])();
            }
            if (local_78._M_head_impl != (OptionalFilter *)0x0) {
              (*((local_78._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
            }
            FVar2 = PUSHED_DOWN_FULLY;
          }
          else {
            make_uniq<duckdb::OptionalFilter>();
            make_uniq<duckdb::InFilter,duckdb::vector<duckdb::Value,true>>
                      ((duckdb *)&local_80,&in_list);
            _Var3._M_head_impl = local_80._M_head_impl;
            local_80._M_head_impl = (TableFilter *)0x0;
            pOVar11 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                      ::operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                                    *)&local_78);
            _Var1._M_head_impl =
                 (pOVar11->child_filter).
                 super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
            (pOVar11->child_filter).
            super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
            super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
            .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var3._M_head_impl;
            if (_Var1._M_head_impl != (TableFilter *)0x0) {
              (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableFilter + 8))();
            }
            local_68._M_head_impl = local_78._M_head_impl;
            local_78._M_head_impl = (OptionalFilter *)0x0;
            TableFilterSet::PushFilter
                      (table_filters,local_70,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_68);
            if (local_68._M_head_impl != (OptionalFilter *)0x0) {
              (*((local_68._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
            }
            local_68._M_head_impl = (OptionalFilter *)0x0;
            if (local_80._M_head_impl != (TableFilter *)0x0) {
              (*(local_80._M_head_impl)->_vptr_TableFilter[1])();
            }
            if (local_78._M_head_impl != (OptionalFilter *)0x0) {
              (*((local_78._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
            }
            FVar2 = PUSHED_DOWN_PARTIALLY;
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&in_list);
          return FVar2;
        }
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,uVar12);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        if ((pEVar7->super_BaseExpression).type != VALUE_CONSTANT) {
          return NO_PUSHDOWN;
        }
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,uVar12);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                           (&pEVar7->super_BaseExpression);
        uVar12 = uVar12 + 1;
      } while ((pBVar9->value).is_null == false);
    }
  }
  return NO_PUSHDOWN;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownInFilter(TableFilterSet &table_filters,
                                                         const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionType() != ExpressionType::COMPARE_IN) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &func = expr.Cast<BoundOperatorExpression>();
	D_ASSERT(func.children.size() > 1);
	if (func.children[0]->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF) {
		// we need col IN (...) to be able to push this down
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &column_ref = func.children[0]->Cast<BoundColumnRefExpression>();
	auto &column_index = column_ids[column_ref.binding.column_index];
	//! check if all children are const expr
	bool children_constant = true;
	for (size_t i {1}; i < func.children.size(); i++) {
		if (func.children[i]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			children_constant = false;
			break;
		}
		auto &const_value_expr = func.children[i]->Cast<BoundConstantExpression>();
		if (const_value_expr.value.IsNull()) {
			// cannot simplify NULL values
			children_constant = false;
			break;
		}
	}
	if (!children_constant) {
		// all children must be constant
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &fst_const_value_expr = func.children[1]->Cast<BoundConstantExpression>();
	auto &type = fst_const_value_expr.value.type();

	if (func.children.size() == 2 && TypeSupportsConstantFilter(type)) {
		// col IN (literal) is equivalent to an equality comparison - push that down
		auto bound_eq_comparison = make_uniq<ConstantFilter>(ExpressionType::COMPARE_EQUAL, fst_const_value_expr.value);
		table_filters.PushFilter(column_index, std::move(bound_eq_comparison));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}

	//! Check if values are consecutive, if yes transform them to >= <= (only for integers)
	// e.g. if we have x IN (1, 2, 3, 4, 5) we transform this into x >= 1 AND x <= 5
	vector<Value> in_list;
	for (idx_t i = 1; i < func.children.size(); i++) {
		auto &const_value_expr = func.children[i]->Cast<BoundConstantExpression>();
		D_ASSERT(!const_value_expr.value.IsNull());
		in_list.push_back(const_value_expr.value);
	}
	if (type.IsIntegral() && IsDenseRange(in_list)) {
		// dense range! turn this into x >= min AND x <= max
		// IsDenseRange sorts in_list, so the front element is the min and the back element is the max
		auto lower_bound =
		    make_uniq<ConstantFilter>(ExpressionType::COMPARE_GREATERTHANOREQUALTO, std::move(in_list.front()));
		auto upper_bound =
		    make_uniq<ConstantFilter>(ExpressionType::COMPARE_LESSTHANOREQUALTO, std::move(in_list.back()));
		table_filters.PushFilter(column_index, std::move(lower_bound));
		table_filters.PushFilter(column_index, std::move(upper_bound));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}
	// if this is not a dense range we can push an optional filter for zone-map pruning
	auto optional_filter = make_uniq<OptionalFilter>();
	auto in_filter = make_uniq<InFilter>(std::move(in_list));
	optional_filter->child_filter = std::move(in_filter);
	table_filters.PushFilter(column_index, std::move(optional_filter));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}